

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

CaseStatement * __thiscall
slang::BumpAllocator::
emplace<slang::ast::CaseStatement,slang::ast::CaseStatementCondition&,slang::ast::UniquePriorityCheck&,slang::ast::Expression_const&,std::span<slang::ast::CaseStatement::ItemGroup,18446744073709551615ul>,slang::ast::Statement_const*&,slang::SourceRange>
          (BumpAllocator *this,CaseStatementCondition *args,UniquePriorityCheck *args_1,
          Expression *args_2,
          span<slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL> *args_3,
          Statement **args_4,SourceRange *args_5)

{
  CaseStatementCondition CVar1;
  UniquePriorityCheck UVar2;
  Statement *pSVar3;
  pointer pIVar4;
  size_t sVar5;
  SourceLocation SVar6;
  SourceLocation SVar7;
  CaseStatement *pCVar8;
  
  pCVar8 = (CaseStatement *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((CaseStatement *)this->endPtr < pCVar8 + 1) {
    pCVar8 = (CaseStatement *)allocateSlow(this,0x48,8);
  }
  else {
    this->head->current = (byte *)(pCVar8 + 1);
  }
  CVar1 = *args;
  UVar2 = *args_1;
  pIVar4 = args_3->_M_ptr;
  sVar5 = (args_3->_M_extent)._M_extent_value;
  pSVar3 = *args_4;
  SVar6 = args_5->startLoc;
  SVar7 = args_5->endLoc;
  (pCVar8->super_Statement).kind = Case;
  (pCVar8->super_Statement).syntax = (StatementSyntax *)0x0;
  (pCVar8->super_Statement).sourceRange.startLoc = SVar6;
  (pCVar8->super_Statement).sourceRange.endLoc = SVar7;
  pCVar8->expr = args_2;
  (pCVar8->items)._M_ptr = pIVar4;
  (pCVar8->items)._M_extent._M_extent_value = sVar5;
  pCVar8->defaultCase = pSVar3;
  pCVar8->condition = CVar1;
  pCVar8->check = UVar2;
  return pCVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }